

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVTools.cpp
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> *
Diligent::OptimizeSPIRV
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *SrcSPIRV,spv_target_env TargetEnv,
          SPIRV_OPTIMIZATION_FLAGS Passes)

{
  pointer puVar1;
  uint32_t *original_binary;
  bool bVar2;
  spv_optimizer_options options;
  spv_validator_options options_00;
  uint uVar3;
  undefined4 in_register_0000000c;
  Optimizer SpirvOptimizer;
  PassToken local_70;
  string local_68;
  MessageConsumer local_48;
  
  if (Passes == SPIRV_OPTIMIZATION_FLAG_NONE) {
    FormatString<char[26],char[39]>
              (&local_68,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Passes != SPIRV_OPTIMIZATION_FLAG_NONE",
               (char (*) [39])CONCAT44(in_register_0000000c,Passes));
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"OptimizeSPIRV",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVTools.cpp"
               ,0x70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if (TargetEnv == SPV_ENV_MAX) {
    puVar1 = (SrcSPIRV->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    TargetEnv = SPV_ENV_VULKAN_1_0;
    if (4 < (ulong)((long)(SrcSPIRV->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1)) {
      uVar3 = puVar1[1];
      uVar3 = uVar3 << 0x18 | uVar3 - 0x10000 >> 8;
      TargetEnv = SPV_ENV_VULKAN_1_3;
      if (uVar3 < 7) {
        TargetEnv = *(spv_target_env *)(&DAT_0082dd6c + (ulong)uVar3 * 4);
      }
    }
  }
  spvtools::Optimizer::Optimizer((Optimizer *)&local_68,TargetEnv);
  local_48.super__Function_base._M_functor._8_8_ = 0;
  local_48.super__Function_base._M_functor._M_unused._M_object =
       anon_unknown_3::SpvOptimizerMessageConsumer;
  local_48._M_invoker =
       std::
       _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_void_(*)(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
       ::_M_invoke;
  local_48.super__Function_base._M_manager =
       std::
       _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_void_(*)(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
       ::_M_manager;
  spvtools::Optimizer::SetMessageConsumer((Optimizer *)&local_68,&local_48);
  if (local_48.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_48.super__Function_base._M_manager)
              ((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
  }
  options = spvOptimizerOptionsCreate();
  if ((Passes & SPIRV_OPTIMIZATION_FLAG_LEGALIZATION) != SPIRV_OPTIMIZATION_FLAG_NONE) {
    spvtools::Optimizer::RegisterLegalizationPasses((Optimizer *)&local_68);
    options_00 = spvValidatorOptionsCreate();
    spvValidatorOptionsSetBeforeHlslLegalization(options_00,true);
    spvOptimizerOptionsSetValidatorOptions(options,options_00);
    spvValidatorOptionsDestroy(options_00);
  }
  if ((Passes & SPIRV_OPTIMIZATION_FLAG_PERFORMANCE) != SPIRV_OPTIMIZATION_FLAG_NONE) {
    spvtools::Optimizer::RegisterPerformancePasses((Optimizer *)&local_68);
  }
  if ((Passes & SPIRV_OPTIMIZATION_FLAG_STRIP_REFLECTION) != SPIRV_OPTIMIZATION_FLAG_NONE) {
    spvtools::CreateStripReflectInfoPass();
    spvtools::Optimizer::RegisterPass((Optimizer *)&local_68,&local_70);
    spvtools::Optimizer::PassToken::~PassToken(&local_70);
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  original_binary =
       (SrcSPIRV->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  bVar2 = spvtools::Optimizer::Run
                    ((Optimizer *)&local_68,original_binary,
                     (long)(SrcSPIRV->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)original_binary >> 2,
                     __return_storage_ptr__,options);
  if ((!bVar2) &&
     (puVar1 = (__return_storage_ptr__->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start,
     (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
     _M_impl.super__Vector_impl_data._M_finish != puVar1)) {
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  spvOptimizerOptionsDestroy(options);
  spvtools::Optimizer::~Optimizer((Optimizer *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> OptimizeSPIRV(const std::vector<uint32_t>& SrcSPIRV, spv_target_env TargetEnv, SPIRV_OPTIMIZATION_FLAGS Passes)
{
    VERIFY_EXPR(Passes != SPIRV_OPTIMIZATION_FLAG_NONE);

    if (TargetEnv == SPV_ENV_MAX)
        TargetEnv = SpvTargetEnvFromSPIRV(SrcSPIRV);

    spvtools::Optimizer SpirvOptimizer(TargetEnv);
    SpirvOptimizer.SetMessageConsumer(SpvOptimizerMessageConsumer);

    spvtools::OptimizerOptions Options;
#ifndef DILIGENT_DEVELOPMENT
    // Do not run validator in release build
    Options.set_run_validator(false);
#endif

    // SPIR-V bytecode generated from HLSL must be legalized to
    // turn it into a valid vulkan SPIR-V shader.
    if (Passes & SPIRV_OPTIMIZATION_FLAG_LEGALIZATION)
    {
        SpirvOptimizer.RegisterLegalizationPasses();

        spvtools::ValidatorOptions ValidatorOptions;
        ValidatorOptions.SetBeforeHlslLegalization(true);
        Options.set_validator_options(ValidatorOptions);
    }

    if (Passes & SPIRV_OPTIMIZATION_FLAG_PERFORMANCE)
    {
        SpirvOptimizer.RegisterPerformancePasses();
    }

    if (Passes & SPIRV_OPTIMIZATION_FLAG_STRIP_REFLECTION)
    {
        // Decorations defined in SPV_GOOGLE_hlsl_functionality1 are the only instructions
        // removed by strip-reflect-info pass. SPIRV offsets become INVALID after this operation.
        SpirvOptimizer.RegisterPass(spvtools::CreateStripReflectInfoPass());
    }

    std::vector<uint32_t> OptimizedSPIRV;
    if (!SpirvOptimizer.Run(SrcSPIRV.data(), SrcSPIRV.size(), &OptimizedSPIRV, Options))
        OptimizedSPIRV.clear();

    return OptimizedSPIRV;
}